

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O2

void __thiscall
disruptor::test::BlockingStrategy::SignalTimeoutWaitingOnCursor::test_method
          (SignalTimeoutWaitingOnCursor *this)

{
  atomic<long> *paVar1;
  thread waiter2;
  thread waiter;
  atomic<long> return_value;
  undefined **local_b8;
  undefined1 local_b0;
  undefined8 *local_a8;
  char *local_a0;
  __atomic_base<long> local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_b8 = (undefined **)operator_new(0x18);
  *local_b8 = (undefined *)&PTR___State_00119bf8;
  local_b8[1] = (undefined *)this;
  local_b8[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_b8,0);
  if (local_b8 != (undefined **)0x0) {
    (**(code **)(*local_b8 + 8))();
  }
  std::thread::join();
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x185);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_00119cf8;
  local_a8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_58 = "";
  waiter2._M_id._M_thread = (id)(id)return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_b8,&local_60,0x185,1,2,&waiter2,"return_value.load()",&kTimeoutSignal,
             "kTimeoutSignal");
  waiter2._M_id._M_thread = (id)0;
  local_b8 = (undefined **)operator_new(0x18);
  *local_b8 = (undefined *)&PTR___State_00119c38;
  local_b8[1] = (undefined *)this;
  local_b8[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter2,&local_b8,0);
  if (local_b8 != (undefined **)0x0) {
    (**(code **)(*local_b8 + 8))();
  }
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).cursor.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  disruptor::BlockingStrategy::SignalAllWhenBlocking
            (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).strategy);
  std::thread::join();
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,399);
  local_b0 = 0;
  local_b8 = &PTR__lazy_ostream_00119cf8;
  local_a8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_88 = "";
  local_98 = return_value.super___atomic_base<long>._M_i;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_b8,&local_90,399,1,2,&local_98,"return_value.load()",&kFirstSequenceValue,
             "kFirstSequenceValue");
  std::thread::~thread(&waiter2);
  std::thread::~thread(&waiter);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}